

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O3

uint fl_utf8toUtf16(char *src,uint srclen,unsigned_short *dst,uint dstlen)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 in_RAX;
  char *end;
  uint uVar5;
  ulong uVar6;
  wchar_t len_1;
  wchar_t len;
  undefined8 local_38;
  
  end = src + srclen;
  local_38 = in_RAX;
  if (dstlen == 0) {
    uVar5 = 0;
  }
  else {
    uVar2 = 0;
    do {
      uVar6 = uVar2;
      uVar4 = (uint)uVar6;
      if (end <= src) {
        dst[uVar6] = 0;
        return uVar4;
      }
      cVar1 = *src;
      if (cVar1 < '\0') {
        uVar3 = fl_utf8decode(src,end,(wchar_t *)((long)&local_38 + 4));
        src = src + local_38._4_4_;
        if (0xffff < uVar3) {
          uVar5 = uVar4 + 2;
          if (dstlen <= uVar5) {
            dst[uVar6] = 0;
            goto joined_r0x001fe123;
          }
          dst[uVar6] = (ushort)(uVar3 + 0xf0000 >> 10) & 0x3ff | 0xd800;
          uVar3 = uVar3 & 0x3ff | 0xdc00;
          uVar6 = (ulong)(uVar4 + 1);
        }
        dst[uVar6] = (unsigned_short)uVar3;
      }
      else {
        src = src + 1;
        dst[uVar6] = (short)cVar1;
      }
      uVar5 = (int)uVar6 + 1;
      uVar2 = (ulong)uVar5;
    } while (uVar5 != dstlen);
    dst[uVar6] = 0;
    uVar5 = dstlen;
  }
joined_r0x001fe123:
  while (src < end) {
    if (*src < '\0') {
      uVar4 = fl_utf8decode(src,end,(wchar_t *)&local_38);
      src = src + (wchar_t)local_38;
      uVar5 = (uVar5 + 1) - (uint)(uVar4 < 0x10000);
    }
    else {
      src = src + 1;
    }
    uVar5 = uVar5 + 1;
  }
  return uVar5;
}

Assistant:

unsigned fl_utf8toUtf16(const char* src, unsigned srclen,
		  unsigned short* dst, unsigned dstlen)
{
  const char* p = src;
  const char* e = src+srclen;
  unsigned count = 0;
  if (dstlen) for (;;) {
    if (p >= e) {dst[count] = 0; return count;}
    if (!(*p & 0x80)) { /* ascii */
      dst[count] = *p++;
    } else {
      int len; unsigned ucs = fl_utf8decode(p,e,&len);
      p += len;
      if (ucs < 0x10000) {
	dst[count] = ucs;
      } else {
	/* make a surrogate pair: */
	if (count+2 >= dstlen) {dst[count] = 0; count += 2; break;}
	dst[count] = (((ucs-0x10000u)>>10)&0x3ff) | 0xd800;
	dst[++count] = (ucs&0x3ff) | 0xdc00;
      }
    }
    if (++count == dstlen) {dst[count-1] = 0; break;}
  }
  /* we filled dst, measure the rest: */
  while (p < e) {
    if (!(*p & 0x80)) p++;
    else {
      int len; unsigned ucs = fl_utf8decode(p,e,&len);
      p += len;
      if (ucs >= 0x10000) ++count;
    }
    ++count;
  }
  return count;
}